

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_ahustore(ASMState *as,IRIns *ir)

{
  ushort uVar1;
  IRIns *pIVar2;
  Reg RVar3;
  long in_RSI;
  ASMState *in_RDI;
  Reg src_2;
  RegSet allow;
  IRIns *irr;
  Reg src_1;
  Reg src;
  RegSet in_stack_ffffffffffffffc8;
  IRRef in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (*(char *)(in_RSI + 6) != -2) {
    if ((*(byte *)(in_RSI + 4) & 0x1f) == 0xe) {
      RVar3 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      asm_fuseahuref(in_RDI,(IRRef)((ulong)in_RSI >> 0x20),(RegSet)in_RSI);
      emit_mrm(in_RDI,XO_MOVSDto,RVar3,0x20);
    }
    else if ((*(byte *)(in_RSI + 4) & 0x1f) == 3) {
      RVar3 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      asm_fuseahuref(in_RDI,(IRRef)((ulong)in_RSI >> 0x20),(RegSet)in_RSI);
      emit_mrm(in_RDI,XO_MOVto,RVar3 | 0x80200,0x20);
    }
    else {
      pIVar2 = in_RDI->ir;
      uVar1 = *(ushort *)(in_RSI + 2);
      RVar3 = 0x80;
      if (0x7fff < *(ushort *)(in_RSI + 2)) {
        RVar3 = ra_alloc1((ASMState *)0xffef00000080,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8);
      }
      asm_fuseahuref(in_RDI,(IRRef)((ulong)in_RSI >> 0x20),(RegSet)in_RSI);
      if ((RVar3 & 0x80) == 0) {
        emit_mrm(in_RDI,XO_MOVto,RVar3,0x20);
      }
      else if (2 < (pIVar2[uVar1].field_1.t.irt & 0x1f)) {
        *(IRRef2 *)(in_RDI->mcp + -4) = pIVar2[uVar1].field_1.op12;
        in_RDI->mcp = in_RDI->mcp + -4;
        emit_mrm(in_RDI,XO_MOVmi,0,0x20);
      }
      (in_RDI->mrm).ofs = (in_RDI->mrm).ofs + 4;
      *(uint *)(in_RDI->mcp + -4) = *(byte *)(in_RSI + 4) & 0x1f ^ 0xffffffff;
      in_RDI->mcp = in_RDI->mcp + -4;
      emit_mrm(in_RDI,XO_MOVmi,0,0x20);
    }
  }
  return;
}

Assistant:

static void asm_ahustore(ASMState *as, IRIns *ir)
{
  if (ir->r == RID_SINK)
    return;
  if (irt_isnum(ir->t)) {
    Reg src = ra_alloc1(as, ir->op2, RSET_FPR);
    asm_fuseahuref(as, ir->op1, RSET_GPR);
    emit_mrm(as, XO_MOVSDto, src, RID_MRM);
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(ir->t)) {
    Reg src = ra_alloc1(as, ir->op2, RSET_GPR);
    asm_fuseahuref(as, ir->op1, rset_exclude(RSET_GPR, src));
    emit_mrm(as, XO_MOVto, src|REX_64, RID_MRM);
#endif
#if LJ_GC64
  } else if (irref_isk(ir->op2)) {
    TValue k;
    lj_ir_kvalue(as->J->L, &k, IR(ir->op2));
    asm_fuseahuref(as, ir->op1, RSET_GPR);
    if (tvisnil(&k)) {
      emit_i32(as, -1);
      emit_mrm(as, XO_MOVmi, REX_64, RID_MRM);
    } else {
      emit_u32(as, k.u32.lo);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
      as->mrm.ofs += 4;
      emit_u32(as, k.u32.hi);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
    }
#endif
  } else {
    IRIns *irr = IR(ir->op2);
    RegSet allow = RSET_GPR;
    Reg src = RID_NONE;
    if (!irref_isk(ir->op2)) {
      src = ra_alloc1(as, ir->op2, allow);
      rset_clear(allow, src);
    }
    asm_fuseahuref(as, ir->op1, allow);
    if (ra_hasreg(src)) {
#if LJ_GC64
      if (!(LJ_DUALNUM && irt_isinteger(ir->t))) {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	as->mrm.ofs += 4;
	emit_u32(as, irt_toitype(ir->t) << 15);
	emit_mrm(as, XO_ARITHi, XOg_OR, RID_MRM);
	as->mrm.ofs -= 4;
	emit_mrm(as, XO_MOVto, src|REX_64, RID_MRM);
	return;
      }
#endif
      emit_mrm(as, XO_MOVto, src, RID_MRM);
    } else if (!irt_ispri(irr->t)) {
      lj_assertA(irt_isaddr(ir->t) || (LJ_DUALNUM && irt_isinteger(ir->t)),
		 "bad store type");
      emit_i32(as, irr->i);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
    }
    as->mrm.ofs += 4;
#if LJ_GC64
    lj_assertA(LJ_DUALNUM && irt_isinteger(ir->t), "bad store type");
    emit_i32(as, LJ_TNUMX << 15);
#else
    emit_i32(as, (int32_t)irt_toitype(ir->t));
#endif
    emit_mrm(as, XO_MOVmi, 0, RID_MRM);
  }
}